

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

void vorbis_deinit(stb_vorbis *p)

{
  Residue *pRVar1;
  Codebook *pCVar2;
  int *local_38;
  Codebook *c;
  Residue *r;
  int j;
  int i;
  stb_vorbis *p_local;
  
  setup_free(p,p->vendor);
  for (r._4_4_ = 0; r._4_4_ < p->comment_list_length; r._4_4_ = r._4_4_ + 1) {
    setup_free(p,p->comment_list[r._4_4_]);
  }
  setup_free(p,p->comment_list);
  if (p->residue_config != (Residue *)0x0) {
    for (r._4_4_ = 0; r._4_4_ < p->residue_count; r._4_4_ = r._4_4_ + 1) {
      pRVar1 = p->residue_config;
      if (pRVar1[r._4_4_].classdata != (uint8 **)0x0) {
        for (r._0_4_ = 0; (int)r < p->codebooks[pRVar1[r._4_4_].classbook].entries;
            r._0_4_ = (int)r + 1) {
          setup_free(p,pRVar1[r._4_4_].classdata[(int)r]);
        }
        setup_free(p,pRVar1[r._4_4_].classdata);
      }
      setup_free(p,pRVar1[r._4_4_].residue_books);
    }
  }
  if (p->codebooks != (Codebook *)0x0) {
    for (r._4_4_ = 0; r._4_4_ < p->codebook_count; r._4_4_ = r._4_4_ + 1) {
      pCVar2 = p->codebooks;
      setup_free(p,pCVar2[r._4_4_].codeword_lengths);
      setup_free(p,pCVar2[r._4_4_].multiplicands);
      setup_free(p,pCVar2[r._4_4_].codewords);
      setup_free(p,pCVar2[r._4_4_].sorted_codewords);
      if (pCVar2[r._4_4_].sorted_values == (int *)0x0) {
        local_38 = (int *)0x0;
      }
      else {
        local_38 = pCVar2[r._4_4_].sorted_values + -1;
      }
      setup_free(p,local_38);
    }
    setup_free(p,p->codebooks);
  }
  setup_free(p,p->floor_config);
  setup_free(p,p->residue_config);
  if (p->mapping != (Mapping *)0x0) {
    for (r._4_4_ = 0; r._4_4_ < p->mapping_count; r._4_4_ = r._4_4_ + 1) {
      setup_free(p,p->mapping[r._4_4_].chan);
    }
    setup_free(p,p->mapping);
  }
  for (r._4_4_ = 0; r._4_4_ < p->channels && r._4_4_ < 0x10; r._4_4_ = r._4_4_ + 1) {
    setup_free(p,p->channel_buffers[r._4_4_]);
    setup_free(p,p->previous_window[r._4_4_]);
    setup_free(p,p->finalY[r._4_4_]);
  }
  for (r._4_4_ = 0; r._4_4_ < 2; r._4_4_ = r._4_4_ + 1) {
    setup_free(p,p->A[r._4_4_]);
    setup_free(p,p->B[r._4_4_]);
    setup_free(p,p->C[r._4_4_]);
    setup_free(p,p->window[r._4_4_]);
    setup_free(p,p->bit_reverse[r._4_4_]);
  }
  if (p->close_on_free != 0) {
    fclose((FILE *)p->f);
  }
  return;
}

Assistant:

static void vorbis_deinit(stb_vorbis *p)
{
   int i,j;

   setup_free(p, p->vendor);
   for (i=0; i < p->comment_list_length; ++i) {
      setup_free(p, p->comment_list[i]);
   }
   setup_free(p, p->comment_list);

   if (p->residue_config) {
      for (i=0; i < p->residue_count; ++i) {
         Residue *r = p->residue_config+i;
         if (r->classdata) {
            for (j=0; j < p->codebooks[r->classbook].entries; ++j)
               setup_free(p, r->classdata[j]);
            setup_free(p, r->classdata);
         }
         setup_free(p, r->residue_books);
      }
   }

   if (p->codebooks) {
      CHECK(p);
      for (i=0; i < p->codebook_count; ++i) {
         Codebook *c = p->codebooks + i;
         setup_free(p, c->codeword_lengths);
         setup_free(p, c->multiplicands);
         setup_free(p, c->codewords);
         setup_free(p, c->sorted_codewords);
         // c->sorted_values[-1] is the first entry in the array
         setup_free(p, c->sorted_values ? c->sorted_values-1 : NULL);
      }
      setup_free(p, p->codebooks);
   }
   setup_free(p, p->floor_config);
   setup_free(p, p->residue_config);
   if (p->mapping) {
      for (i=0; i < p->mapping_count; ++i)
         setup_free(p, p->mapping[i].chan);
      setup_free(p, p->mapping);
   }
   CHECK(p);
   for (i=0; i < p->channels && i < STB_VORBIS_MAX_CHANNELS; ++i) {
      setup_free(p, p->channel_buffers[i]);
      setup_free(p, p->previous_window[i]);
      #ifdef STB_VORBIS_NO_DEFER_FLOOR
      setup_free(p, p->floor_buffers[i]);
      #endif
      setup_free(p, p->finalY[i]);
   }
   for (i=0; i < 2; ++i) {
      setup_free(p, p->A[i]);
      setup_free(p, p->B[i]);
      setup_free(p, p->C[i]);
      setup_free(p, p->window[i]);
      setup_free(p, p->bit_reverse[i]);
   }
   #ifndef STB_VORBIS_NO_STDIO
   if (p->close_on_free) fclose(p->f);
   #endif
}